

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall
WriterTest_WriteDoubleWithFilledBuffer_Test::TestBody
          (WriterTest_WriteDoubleWithFilledBuffer_Test *this)

{
  ulong uVar1;
  size_t sVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  char *message;
  AssertionResult gtest_ar;
  writer writer;
  memory_buffer buf;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  AssertHelper local_290;
  internal local_288 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_278;
  format_specs local_268;
  basic_buffer<char> local_248;
  char local_228 [504];
  
  local_248.size_ = 0;
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3c18;
  local_248.capacity_ = 500;
  local_278.out_.container = &local_248;
  local_278.locale_.locale_ = (void *)0x0;
  iVar5 = 500;
  local_248.ptr_ = local_228;
  do {
    iVar3.container = local_278.out_.container;
    sVar2 = (local_278.out_.container)->size_;
    uVar1 = sVar2 + 1;
    if ((local_278.out_.container)->capacity_ < uVar1) {
      (**(local_278.out_.container)->_vptr_basic_buffer)(local_278.out_.container,uVar1);
    }
    (iVar3.container)->size_ = uVar1;
    (iVar3.container)->ptr_[sVar2] = ' ';
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_268.super_align_spec.width_ = 0;
  local_268.super_align_spec.fill_ = L' ';
  local_268.super_align_spec.align_ = ALIGN_DEFAULT;
  local_268.super_core_format_specs.precision = -1;
  local_268.super_core_format_specs.flags = '\0';
  local_268.super_core_format_specs.type = '\0';
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_double<double>(&local_278,1.2,&local_268);
  local_268.super_align_spec._0_8_ = local_248.ptr_ + 500;
  local_268._8_8_ = local_248.size_ - 500;
  testing::internal::CmpHelperEQ<char[4],fmt::v5::basic_string_view<char>>
            (local_288,"\"1.2\"","sv",(char (*) [4])0x2428ed,(basic_string_view<char> *)&local_268);
  if (local_288[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_280.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2a6,message);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_298.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_298.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3c18;
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_);
  }
  return;
}

Assistant:

TEST(WriterTest, WriteDoubleWithFilledBuffer) {
  memory_buffer buf;
  fmt::writer writer(buf);
  // Fill the buffer.
  for (int i = 0; i < fmt::inline_buffer_size; ++i)
    writer.write(' ');
  writer.write(1.2);
  fmt::string_view sv(buf.data(), buf.size());
  sv.remove_prefix(fmt::inline_buffer_size);
  EXPECT_EQ("1.2", sv);
}